

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O3

void __thiscall phoenix_evsa_t::evsa_entry_t::_read(evsa_entry_t *this)

{
  kstruct *pkVar1;
  byte bVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  evsa_data_t *this_00;
  uint uVar5;
  
  bVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_entry_type = bVar2;
  this->n_checksum = true;
  if (((bVar2 - 0xe1 < 0xf) && ((0x7007U >> (bVar2 - 0xe1 & 0x1f) & 1) != 0)) || (bVar2 == 0x83)) {
    this->n_checksum = false;
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_checksum = uVar3;
    bVar2 = this->m_entry_type;
  }
  this->n_len_evsa_entry = true;
  uVar5 = bVar2 - 0xe1;
  if (((uVar5 < 0xf) && ((0x7007U >> (uVar5 & 0x1f) & 1) != 0)) || (bVar2 == 0x83)) {
    this->n_len_evsa_entry = false;
    uVar4 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
    this->m_len_evsa_entry = uVar4;
    bVar2 = this->m_entry_type;
  }
  switch(bVar2) {
  case 0xe1:
    this_00 = (evsa_data_t *)operator_new(0x48);
    evsa_guid_t::evsa_guid_t((evsa_guid_t *)this_00,(this->super_kstruct).m__io,this,this->m__root);
    break;
  case 0xe2:
    this_00 = (evsa_data_t *)operator_new(0x48);
    evsa_name_t::evsa_name_t((evsa_name_t *)this_00,(this->super_kstruct).m__io,this,this->m__root);
    break;
  case 0xe3:
    this_00 = (evsa_data_t *)operator_new(0x88);
    evsa_data_t::evsa_data_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
    break;
  case 0xed:
    this_00 = (evsa_data_t *)operator_new(0x48);
    evsa_guid_t::evsa_guid_t((evsa_guid_t *)this_00,(this->super_kstruct).m__io,this,this->m__root);
    break;
  case 0xee:
    this_00 = (evsa_data_t *)operator_new(0x48);
    evsa_name_t::evsa_name_t((evsa_name_t *)this_00,(this->super_kstruct).m__io,this,this->m__root);
    break;
  case 0xef:
    this_00 = (evsa_data_t *)operator_new(0x88);
    evsa_data_t::evsa_data_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
    break;
  default:
    if (bVar2 == 0x83) {
      this_00 = (evsa_data_t *)operator_new(0x88);
      evsa_data_t::evsa_data_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
      break;
    }
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
    this_00 = (evsa_data_t *)operator_new(0x40);
    evsa_unknown_t::evsa_unknown_t
              ((evsa_unknown_t *)this_00,(this->super_kstruct).m__io,this,this->m__root);
  }
  pkVar1 = (this->m_body)._M_t.
           super___uniq_ptr_impl<kaitai::kstruct,_std::default_delete<kaitai::kstruct>_>._M_t.
           super__Tuple_impl<0UL,_kaitai::kstruct_*,_std::default_delete<kaitai::kstruct>_>.
           super__Head_base<0UL,_kaitai::kstruct_*,_false>._M_head_impl;
  (this->m_body)._M_t.super___uniq_ptr_impl<kaitai::kstruct,_std::default_delete<kaitai::kstruct>_>.
  _M_t.super__Tuple_impl<0UL,_kaitai::kstruct_*,_std::default_delete<kaitai::kstruct>_>.
  super__Head_base<0UL,_kaitai::kstruct_*,_false>._M_head_impl = &this_00->super_kstruct;
  if (pkVar1 == (kstruct *)0x0) {
    return;
  }
  (*pkVar1->_vptr_kstruct[1])();
  return;
}

Assistant:

void phoenix_evsa_t::evsa_entry_t::_read() {
    m_entry_type = m__io->read_u1();
    n_checksum = true;
    if ( ((entry_type() == 225) || (entry_type() == 226) || (entry_type() == 227) || (entry_type() == 237) || (entry_type() == 238) || (entry_type() == 239) || (entry_type() == 131)) ) {
        n_checksum = false;
        m_checksum = m__io->read_u1();
    }
    n_len_evsa_entry = true;
    if ( ((entry_type() == 225) || (entry_type() == 226) || (entry_type() == 227) || (entry_type() == 237) || (entry_type() == 238) || (entry_type() == 239) || (entry_type() == 131)) ) {
        n_len_evsa_entry = false;
        m_len_evsa_entry = m__io->read_u2le();
    }
    switch (entry_type()) {
    case 239: {
        m_body = std::unique_ptr<evsa_data_t>(new evsa_data_t(m__io, this, m__root));
        break;
    }
    case 131: {
        m_body = std::unique_ptr<evsa_data_t>(new evsa_data_t(m__io, this, m__root));
        break;
    }
    case 227: {
        m_body = std::unique_ptr<evsa_data_t>(new evsa_data_t(m__io, this, m__root));
        break;
    }
    case 237: {
        m_body = std::unique_ptr<evsa_guid_t>(new evsa_guid_t(m__io, this, m__root));
        break;
    }
    case 226: {
        m_body = std::unique_ptr<evsa_name_t>(new evsa_name_t(m__io, this, m__root));
        break;
    }
    case 225: {
        m_body = std::unique_ptr<evsa_guid_t>(new evsa_guid_t(m__io, this, m__root));
        break;
    }
    case 238: {
        m_body = std::unique_ptr<evsa_name_t>(new evsa_name_t(m__io, this, m__root));
        break;
    }
    default: {
        m_body = std::unique_ptr<evsa_unknown_t>(new evsa_unknown_t(m__io, this, m__root));
        break;
    }
    }
}